

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O0

int __thiscall
CorUnix::CSynchCache<CorUnix::CSynchData>::Get
          (CSynchCache<CorUnix::CSynchData> *this,CPalThread *pthrCurrent,int n,CSynchData **ppObjs)

{
  _USynchCacheStackNode *p_Var1;
  bool local_52;
  int local_44;
  int local_40;
  int local_3c;
  int j;
  int i;
  USynchCacheStackNode *pNode;
  void *pvObjRaw;
  CSynchData **ppObjs_local;
  CPalThread *pCStack_18;
  int n_local;
  CPalThread *pthrCurrent_local;
  CSynchCache<CorUnix::CSynchData> *this_local;
  
  local_3c = 0;
  pvObjRaw = ppObjs;
  ppObjs_local._4_4_ = n;
  pCStack_18 = pthrCurrent;
  pthrCurrent_local = (CPalThread *)this;
  Lock(this,pthrCurrent);
  for (_j = ::Volatile::operator_cast_to__USynchCacheStackNode_((Volatile *)this);
      _j != (_USynchCacheStackNode *)0x0 && local_3c < ppObjs_local._4_4_; _j = _j->next) {
    *(_USynchCacheStackNode **)((long)pvObjRaw + (long)local_3c * 8) = _j;
    local_3c = local_3c + 1;
  }
  Volatile<CorUnix::CSynchCache<CorUnix::CSynchData>::_USynchCacheStackNode_*>::operator=
            (&this->m_pHead,_j);
  Volatile<int>::operator-=(&this->m_iDepth,local_3c);
  p_Var1 = ::Volatile::operator_cast_to__USynchCacheStackNode_((Volatile *)this);
  local_52 = false;
  if (p_Var1 == (_USynchCacheStackNode *)0x0) {
    local_44 = 0;
    local_52 = Volatile<int>::operator!=(&this->m_iDepth,&local_44);
  }
  if (local_52 != false) {
    fprintf(_stderr,"SYNCCACHE: Invalid cache depth value");
    DebugBreak();
  }
  Unlock(this,pCStack_18);
  local_40 = local_3c;
  while ((local_40 < ppObjs_local._4_4_ &&
         (pNode = InternalNew<CorUnix::CSynchCache<CorUnix::CSynchData>::_USynchCacheStackNode>(),
         pNode != (_USynchCacheStackNode *)0x0))) {
    memset(pNode,0,0x58);
    *(USynchCacheStackNode **)((long)pvObjRaw + (long)local_40 * 8) = pNode;
    local_40 = local_40 + 1;
  }
  for (local_3c = 0; local_3c < local_40; local_3c = local_3c + 1) {
    CSynchData::CSynchData(*(CSynchData **)((long)pvObjRaw + (long)local_3c * 8));
  }
  return local_40;
}

Assistant:

int Get(CPalThread * pthrCurrent, int n, T ** ppObjs)
        {
            void * pvObjRaw;
            USynchCacheStackNode * pNode;
            int i = 0,j;

            Lock(pthrCurrent);
            pNode = m_pHead;
            while (pNode && i < n)
            {
                ppObjs[i] = (T *)pNode;
                pNode = pNode->next;
                i++;
            }
            m_pHead = pNode;
            m_iDepth -= i;

#ifdef _DEBUG
            if (NULL == m_pHead && m_iDepth != 0)
            {
                // Can't use ASSERT here, since this is header
                // is included by other headers with inline methods
                // which causes template instatiation in the header
                // where the DEBUG CHANNEL is not defined and cannot
                // be defined
                fprintf(stderr,"SYNCCACHE: Invalid cache depth value");
                DebugBreak();
            }
#endif // _DEBUG

            Unlock(pthrCurrent);

            for (j=i;j<n;j++)
            {
                pvObjRaw = (void *) InternalNew<USynchCacheStackNode>();
                if (NULL == pvObjRaw)
                    break;
#ifdef _DEBUG
                memset(pvObjRaw, 0, sizeof(USynchCacheStackNode));
#endif
                ppObjs[j] = reinterpret_cast<T*>(pvObjRaw);
            }

            for (i=0;i<j;i++)
            {
                new ((void *)ppObjs[i]) T;
            }

            return j;
        }